

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned_int,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<1>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,bin_writer<1> f)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<1>_>
  local_50;
  
  local_50.prefix.size_ = prefix.size_;
  local_50.prefix.data_ = prefix.data_;
  uVar2 = (uint)num_digits + local_50.prefix.size_;
  local_50.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar1 = (ulong)(uint)specs.width;
    local_50.size_ = uVar2;
    local_50.padding = 0;
    if (uVar2 <= uVar1) {
      local_50.size_ = uVar1;
      local_50.padding = uVar1 - uVar2;
    }
  }
  else {
    local_50.padding = 0;
    uVar3 = specs.precision - num_digits;
    local_50.fill = '0';
    if (uVar3 == 0 || specs.precision < num_digits) {
      local_50.fill = specs.fill.data_[0];
    }
    if (uVar3 != 0 && num_digits <= specs.precision) {
      uVar2 = (uint)specs.precision + local_50.prefix.size_;
      local_50.padding = (ulong)uVar3;
    }
    local_50.size_ = uVar2;
    if (((undefined1  [20])specs & (undefined1  [20])0xf00) == (undefined1  [20])0x0) {
      specs._9_1_ = specs._9_1_ | 2;
    }
  }
  local_50.f = f;
  write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned_int,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<1>>>
            (this,&specs,&local_50);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }